

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bootstrap_analysis *
Catch::Benchmark::Detail::analyse_samples
          (bootstrap_analysis *__return_storage_ptr__,double confidence_level,uint n_resamples,
          iterator first,iterator last)

{
  Estimate<double> mean_00;
  Estimate<double> stddev_00;
  int iVar1;
  difference_type dVar2;
  double dVar3;
  double outlier_variance;
  Estimate<double> stddev_estimate;
  Estimate<double> mean_estimate;
  anon_class_32_4_6f2d8bc5 Estimate;
  _func_double_const_iterator_const_iterator *stddev;
  _func_double_const_iterator_const_iterator *mean;
  int n;
  uint n_resamples_local;
  double confidence_level_local;
  iterator last_local;
  iterator first_local;
  
  confidence_level_local = (double)last._M_current;
  last_local._M_current = first._M_current;
  if (analyse_samples(double,unsigned_int,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)
      ::entropy == '\0') {
    iVar1 = __cxa_guard_acquire(&analyse_samples(double,unsigned_int,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)
                                 ::entropy);
    if (iVar1 != 0) {
      std::random_device::random_device(&analyse_samples::entropy);
      __cxa_atexit(std::random_device::~random_device,&analyse_samples::entropy,&__dso_handle);
      __cxa_guard_release(&analyse_samples(double,unsigned_int,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)
                           ::entropy);
    }
  }
  dVar2 = __gnu_cxx::operator-
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     &confidence_level_local,&last_local);
  mean_estimate.confidence_interval._0_4_ = n_resamples;
  analyse_samples::anon_class_32_4_6f2d8bc5::operator()
            ((Estimate<double> *)&stddev_estimate.confidence_interval,
             (anon_class_32_4_6f2d8bc5 *)&mean_estimate.confidence_interval,Detail::mean);
  analyse_samples::anon_class_32_4_6f2d8bc5::operator()
            ((Estimate<double> *)&outlier_variance,
             (anon_class_32_4_6f2d8bc5 *)&mean_estimate.confidence_interval,
             anon_unknown_12::standard_deviation);
  mean_00.lower_bound = mean_estimate.point;
  mean_00.point = stddev_estimate.confidence_interval;
  mean_00.upper_bound = mean_estimate.lower_bound;
  mean_00.confidence_interval = mean_estimate.upper_bound;
  stddev_00.lower_bound = stddev_estimate.point;
  stddev_00.point = outlier_variance;
  stddev_00.upper_bound = stddev_estimate.lower_bound;
  stddev_00.confidence_interval = stddev_estimate.upper_bound;
  dVar3 = anon_unknown_12::outlier_variance(mean_00,stddev_00,(int)dVar2);
  (__return_storage_ptr__->mean).point = stddev_estimate.confidence_interval;
  (__return_storage_ptr__->mean).lower_bound = mean_estimate.point;
  (__return_storage_ptr__->mean).upper_bound = mean_estimate.lower_bound;
  (__return_storage_ptr__->mean).confidence_interval = mean_estimate.upper_bound;
  (__return_storage_ptr__->standard_deviation).point = outlier_variance;
  (__return_storage_ptr__->standard_deviation).lower_bound = stddev_estimate.point;
  (__return_storage_ptr__->standard_deviation).upper_bound = stddev_estimate.lower_bound;
  (__return_storage_ptr__->standard_deviation).confidence_interval = stddev_estimate.upper_bound;
  __return_storage_ptr__->outlier_variance = dVar3;
  return __return_storage_ptr__;
}

Assistant:

bootstrap_analysis analyse_samples(double confidence_level,
                                               unsigned int n_resamples,
                                               std::vector<double>::iterator first,
                                               std::vector<double>::iterator last) {
                CATCH_INTERNAL_START_WARNINGS_SUPPRESSION
                CATCH_INTERNAL_SUPPRESS_GLOBALS_WARNINGS
                static std::random_device entropy;
                CATCH_INTERNAL_STOP_WARNINGS_SUPPRESSION

                auto n = static_cast<int>(last - first); // seriously, one can't use integral types without hell in C++

                auto mean = &Detail::mean;
                auto stddev = &standard_deviation;

#if defined(CATCH_CONFIG_USE_ASYNC)
                auto Estimate = [=](double(*f)(std::vector<double>::const_iterator,
                                               std::vector<double>::const_iterator)) {
                    auto seed = entropy();
                    return std::async(std::launch::async, [=] {
                        std::mt19937 rng(seed);
                        auto resampled = resample(rng, n_resamples, first, last, f);
                        return bootstrap(confidence_level, first, last, resampled, f);
                    });
                };

                auto mean_future = Estimate(mean);
                auto stddev_future = Estimate(stddev);

                auto mean_estimate = mean_future.get();
                auto stddev_estimate = stddev_future.get();
#else
                auto Estimate = [=](double(*f)(std::vector<double>::const_iterator,
                                               std::vector<double>::const_iterator)) {
                    auto seed = entropy();
                    std::mt19937 rng(seed);
                    auto resampled = resample(rng, n_resamples, first, last, f);
                    return bootstrap(confidence_level, first, last, resampled, f);
                };

                auto mean_estimate = Estimate(mean);
                auto stddev_estimate = Estimate(stddev);
#endif // CATCH_USE_ASYNC

                double outlier_variance = Detail::outlier_variance(mean_estimate, stddev_estimate, n);

                return { mean_estimate, stddev_estimate, outlier_variance };
            }